

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  ImGuiContext *ctx;
  char *__dest;
  char *pcVar1;
  char *pcVar2;
  ImGuiSettingsHandler *pIVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  
  ctx = GImGui;
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  __dest = (char *)MemAlloc(ini_size + 1);
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  pIVar3 = (ImGuiSettingsHandler *)0x0;
  pvVar4 = (void *)0x0;
  pcVar6 = __dest;
  while (pcVar6 < __dest + ini_size) {
    for (; (*pcVar6 == '\n' || (pcVar5 = pcVar6, *pcVar6 == '\r')); pcVar6 = pcVar6 + 1) {
    }
    for (; ((pcVar5 < __dest + ini_size && (*pcVar5 != '\n')) && (*pcVar5 != '\r'));
        pcVar5 = pcVar5 + 1) {
    }
    *pcVar5 = '\0';
    if (*pcVar6 != ';') {
      if (((*pcVar6 == '[') && (pcVar6 < pcVar5)) && (pcVar5[-1] == ']')) {
        pcVar2 = pcVar5 + -1;
        *pcVar2 = '\0';
        pcVar1 = ImStrchrRange(pcVar6 + 1,pcVar2,']');
        if ((pcVar1 != (char *)0x0) &&
           (pcVar2 = ImStrchrRange(pcVar1 + 1,pcVar2,'['), pcVar2 != (char *)0x0)) {
          *pcVar1 = '\0';
          pIVar3 = FindSettingsHandler(pcVar6 + 1);
          if (pIVar3 == (ImGuiSettingsHandler *)0x0) {
            pIVar3 = (ImGuiSettingsHandler *)0x0;
            pvVar4 = (void *)0x0;
          }
          else {
            pvVar4 = (*pIVar3->ReadOpenFn)(ctx,pIVar3,pcVar2 + 1);
          }
        }
      }
      else if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (pvVar4 != (void *)0x0)) {
        (*pIVar3->ReadLineFn)(ctx,pIVar3,pvVar4,pcVar6);
      }
    }
    pcVar6 = pcVar5 + 1;
  }
  MemFree(__dest);
  ctx->SettingsLoaded = true;
  DockContextOnLoadSettings(ctx);
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)IM_ALLOC(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    IM_FREE(buf);
    g.SettingsLoaded = true;
    DockContextOnLoadSettings(&g);
}